

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O0

int mbedtls_ecjpake_write_round_two
              (mbedtls_ecjpake_context *ctx,uchar *buf,size_t len,size_t *olen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  size_t local_d8;
  size_t ec_len;
  uchar *end;
  uchar *p;
  mbedtls_mpi xm;
  mbedtls_ecp_point Xm;
  mbedtls_ecp_point G;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  size_t *olen_local;
  size_t len_local;
  uchar *buf_local;
  mbedtls_ecjpake_context *ctx_local;
  
  ec_len = (size_t)(buf + len);
  end = buf;
  mbedtls_ecp_point_init((mbedtls_ecp_point *)&Xm.Z.s);
  mbedtls_ecp_point_init((mbedtls_ecp_point *)&xm.s);
  mbedtls_mpi_init((mbedtls_mpi *)&p);
  G.Z._12_4_ = ecjpake_ecp_add3(&ctx->grp,(mbedtls_ecp_point *)&Xm.Z.s,&ctx->Xp1,&ctx->Xp2,&ctx->Xm1
                               );
  if (((G.Z._12_4_ != 0) ||
      (G.Z._12_4_ = ecjpake_mul_secret((mbedtls_mpi *)&p,1,&ctx->xm2,&ctx->s,&(ctx->grp).N,f_rng,
                                       p_rng), G.Z._12_4_ != 0)) ||
     (G.Z._12_4_ = mbedtls_ecp_mul(&ctx->grp,(mbedtls_ecp_point *)&xm.s,(mbedtls_mpi *)&p,
                                   (mbedtls_ecp_point *)&Xm.Z.s,f_rng,p_rng), G.Z._12_4_ != 0))
  goto LAB_00372300;
  if (ctx->role == MBEDTLS_ECJPAKE_SERVER) {
    if (ec_len < end) {
      G.Z._12_4_ = 0xffffb100;
      goto LAB_00372300;
    }
    G.Z._12_4_ = mbedtls_ecp_tls_write_group(&ctx->grp,&local_d8,end,ec_len - (long)end);
    if (G.Z._12_4_ != 0) goto LAB_00372300;
    end = end + local_d8;
  }
  if (ec_len < end) {
    G.Z._12_4_ = 0xffffb100;
  }
  else {
    G.Z._12_4_ = mbedtls_ecp_tls_write_point
                           (&ctx->grp,(mbedtls_ecp_point *)&xm.s,ctx->point_format,&local_d8,end,
                            ec_len - (long)end);
    if (G.Z._12_4_ == 0) {
      end = end + local_d8;
      G.Z._12_4_ = ecjpake_zkp_write(ctx->md_type,&ctx->grp,ctx->point_format,
                                     (mbedtls_ecp_point *)&Xm.Z.s,(mbedtls_mpi *)&p,
                                     (mbedtls_ecp_point *)&xm.s,ecjpake_id[ctx->role],&end,
                                     (uchar *)ec_len,f_rng,p_rng);
      if (G.Z._12_4_ == 0) {
        *olen = (long)end - (long)buf;
      }
    }
  }
LAB_00372300:
  mbedtls_ecp_point_free((mbedtls_ecp_point *)&Xm.Z.s);
  mbedtls_ecp_point_free((mbedtls_ecp_point *)&xm.s);
  mbedtls_mpi_free((mbedtls_mpi *)&p);
  return G.Z._12_4_;
}

Assistant:

int mbedtls_ecjpake_write_round_two(mbedtls_ecjpake_context *ctx,
                                    unsigned char *buf, size_t len, size_t *olen,
                                    int (*f_rng)(void *, unsigned char *, size_t),
                                    void *p_rng)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_ecp_point G;    /* C: GA, S: GB */
    mbedtls_ecp_point Xm;   /* C: Xc, S: Xs */
    mbedtls_mpi xm;         /* C: xc, S: xs */
    unsigned char *p = buf;
    const unsigned char *end = buf + len;
    size_t ec_len;

    mbedtls_ecp_point_init(&G);
    mbedtls_ecp_point_init(&Xm);
    mbedtls_mpi_init(&xm);

    /*
     * First generate private/public key pair (S: 7.4.2.5.1, C: 7.4.2.6.1)
     *
     * Client:  GA = X1  + X3  + X4  | xs = x2  * s | Xc = xc * GA
     * Server:  GB = X3  + X1  + X2  | xs = x4  * s | Xs = xs * GB
     * Unified: G  = Xm1 + Xp1 + Xp2 | xm = xm2 * s | Xm = xm * G
     */
    MBEDTLS_MPI_CHK(ecjpake_ecp_add3(&ctx->grp, &G,
                                     &ctx->Xp1, &ctx->Xp2, &ctx->Xm1));
    MBEDTLS_MPI_CHK(ecjpake_mul_secret(&xm, 1, &ctx->xm2, &ctx->s,
                                       &ctx->grp.N, f_rng, p_rng));
    MBEDTLS_MPI_CHK(mbedtls_ecp_mul(&ctx->grp, &Xm, &xm, &G, f_rng, p_rng));

    /*
     * Now write things out
     *
     * struct {
     *     ECParameters curve_params;   // only server writing its message
     *     ECJPAKEKeyKP ecjpake_key_kp;
     * } Client/ServerECJPAKEParams;
     */
    if (ctx->role == MBEDTLS_ECJPAKE_SERVER) {
        if (end < p) {
            ret = MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
            goto cleanup;
        }
        MBEDTLS_MPI_CHK(mbedtls_ecp_tls_write_group(&ctx->grp, &ec_len,
                                                    p, end - p));
        p += ec_len;
    }

    if (end < p) {
        ret = MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
        goto cleanup;
    }
    MBEDTLS_MPI_CHK(mbedtls_ecp_tls_write_point(&ctx->grp, &Xm,
                                                ctx->point_format, &ec_len, p, end - p));
    p += ec_len;

    MBEDTLS_MPI_CHK(ecjpake_zkp_write(ctx->md_type, &ctx->grp,
                                      ctx->point_format,
                                      &G, &xm, &Xm, ID_MINE,
                                      &p, end, f_rng, p_rng));

    *olen = p - buf;

cleanup:
    mbedtls_ecp_point_free(&G);
    mbedtls_ecp_point_free(&Xm);
    mbedtls_mpi_free(&xm);

    return ret;
}